

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
DescriptorKeyInfo_GetExtPrivkeyInformation_Test::DescriptorKeyInfo_GetExtPrivkeyInformation_Test
          (DescriptorKeyInfo_GetExtPrivkeyInformation_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005bf658;
  return;
}

Assistant:

TEST(DescriptorKeyInfo, GetExtPrivkeyInformation) {
  std::string extkey = "tprv8fFXTTUs3e5Q1CGAPnabXXFUJor2q2jXo3VCceUggUNGMgCQ4FsLgPemcq2FPym15qZ2kjNx414T3Ypha1gAL3GHUH3uN3xDB3ymD434uWh";
  ExtPrivkey privkey(extkey);
  std::string path = "0'/1";
  std::string ext_str = "[f4a831a2]";
  std::string ext_path_str = "[f4a831a2/" + path + "]";
  std::string key_str;

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, ""));
  EXPECT_STREQ(key_str.c_str(), ext_str.c_str());

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, path));
  EXPECT_STREQ(key_str.c_str(), ext_path_str.c_str());
}